

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O0

bool __thiscall zmq::radix_tree_t::add(radix_tree_t *this,uchar *key_,size_t key_size_)

{
  uint32_t uVar1;
  node_t nVar2;
  uchar *__dest;
  uchar *puVar3;
  node_t *this_00;
  long in_RDX;
  undefined8 *in_RDI;
  node_t split_node_1;
  node_t split_node;
  node_t key_node;
  node_t key_node_1;
  node_t parent_node;
  node_t current_node;
  size_t edge_index;
  size_t prefix_bytes_matched;
  size_t key_bytes_matched;
  match_result_t match_result;
  node_t *in_stack_fffffffffffffed0;
  node_t *in_stack_fffffffffffffed8;
  node_t in_stack_fffffffffffffee0;
  node_t *in_stack_fffffffffffffee8;
  node_t *this_01;
  node_t in_stack_fffffffffffffef0;
  node_t local_c8 [2];
  uchar *local_b8;
  uchar *local_b0;
  node_t local_a8;
  node_t local_a0 [2];
  uchar *local_90;
  undefined8 in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  node_t in_stack_ffffffffffffff88;
  radix_tree_t *in_stack_ffffffffffffff90;
  long local_58;
  node_t *local_50;
  uchar *local_38;
  bool local_1;
  
  match(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88._data,in_stack_ffffffffffffff80,
        SUB81((ulong)in_stack_ffffffffffffff78 >> 0x38,0));
  if (local_58 == in_RDX) {
    this_01 = local_50;
    uVar1 = node_t::prefix_length((node_t *)&stack0xffffffffffffff88);
    if (this_01 == (node_t *)(ulong)uVar1) {
      if (local_58 != in_RDX) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","key_bytes_matched == key_size_",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radix_tree.cpp"
                ,0x192);
        fflush(_stderr);
        zmq_abort((char *)0x23ed62);
      }
      uVar1 = node_t::prefix_length((node_t *)&stack0xffffffffffffff88);
      if (local_50 != (node_t *)(ulong)uVar1) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "prefix_bytes_matched == current_node.prefix_length ()",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radix_tree.cpp"
                ,0x193);
        fflush(_stderr);
        zmq_abort((char *)0x23edde);
      }
      in_RDI[1] = in_RDI[1] + 1;
      uVar1 = node_t::refcount((node_t *)&stack0xffffffffffffff88);
      node_t::set_refcount((node_t *)&stack0xffffffffffffff88,uVar1 + 1);
      uVar1 = node_t::refcount((node_t *)&stack0xffffffffffffff88);
      local_1 = uVar1 == 1;
    }
    else {
      uVar1 = node_t::refcount((node_t *)&stack0xffffffffffffff88);
      this_00 = (node_t *)(ulong)uVar1;
      uVar1 = node_t::prefix_length((node_t *)&stack0xffffffffffffff88);
      nVar2._data = (uchar *)((ulong)uVar1 - (long)local_50);
      node_t::edgecount((node_t *)&stack0xffffffffffffff88);
      local_c8[0] = make_node((size_t)this_01,nVar2._data,(size_t)this_00);
      node_t::prefix((node_t *)&stack0xffffffffffffff88);
      node_t::set_prefix((node_t *)nVar2._data,(uchar *)this_00);
      node_t::first_bytes(in_stack_fffffffffffffed0);
      node_t::set_first_bytes((node_t *)nVar2._data,(uchar *)this_00);
      node_t::node_pointers((node_t *)nVar2._data);
      node_t::set_node_pointers((node_t *)nVar2._data,(uchar *)this_00);
      node_t::resize((node_t *)in_stack_fffffffffffffef0._data,(size_t)this_01,(size_t)nVar2._data);
      node_t::prefix(local_c8);
      node_t::set_edge_at(this_01,(size_t)nVar2._data,(uchar)((ulong)this_00 >> 0x38),
                          in_stack_fffffffffffffef0);
      node_t::set_refcount((node_t *)&stack0xffffffffffffff88,1);
      in_RDI[1] = in_RDI[1] + 1;
      node_t::set_node_at(this_00,(size_t)in_stack_fffffffffffffed0,nVar2);
      local_1 = true;
    }
  }
  else {
    uVar1 = node_t::prefix_length((node_t *)&stack0xffffffffffffff88);
    if (local_50 == (node_t *)(ulong)uVar1) {
      nVar2 = make_node((size_t)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0._data,
                        (size_t)in_stack_fffffffffffffed8);
      node_t::set_prefix((node_t *)in_stack_fffffffffffffee0._data,
                         (uchar *)in_stack_fffffffffffffed8);
      node_t::prefix_length((node_t *)&stack0xffffffffffffff88);
      node_t::edgecount((node_t *)&stack0xffffffffffffff88);
      node_t::resize((node_t *)in_stack_fffffffffffffef0._data,(size_t)in_stack_fffffffffffffee8,
                     (size_t)in_stack_fffffffffffffee0._data);
      __dest = node_t::node_pointers(in_stack_fffffffffffffee0._data);
      puVar3 = node_t::node_pointers(in_stack_fffffffffffffee0._data);
      uVar1 = node_t::edgecount((node_t *)&stack0xffffffffffffff88);
      memmove(__dest,puVar3 + -1,(ulong)(uVar1 - 1) << 3);
      local_90 = nVar2._data;
      node_t::edgecount((node_t *)&stack0xffffffffffffff88);
      node_t::set_edge_at(in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0._data,
                          (uchar)((ulong)in_stack_fffffffffffffed8 >> 0x38),
                          in_stack_fffffffffffffef0);
      uVar1 = node_t::prefix_length((node_t *)&stack0xffffffffffffff88);
      if (uVar1 == 0) {
        *in_RDI = local_38;
      }
      else {
        node_t::set_node_at(in_stack_fffffffffffffed8,(size_t)in_stack_fffffffffffffed0,
                            in_stack_fffffffffffffee0);
      }
      in_RDI[1] = in_RDI[1] + 1;
      local_1 = true;
    }
    else {
      local_a0[0] = make_node((size_t)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0._data,
                              (size_t)in_stack_fffffffffffffed8);
      uVar1 = node_t::refcount((node_t *)&stack0xffffffffffffff88);
      nVar2._data = (uchar *)(ulong)uVar1;
      node_t::prefix_length((node_t *)&stack0xffffffffffffff88);
      node_t::edgecount((node_t *)&stack0xffffffffffffff88);
      local_a8 = make_node((size_t)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0._data,
                           (size_t)in_stack_fffffffffffffed8);
      node_t::set_prefix((node_t *)in_stack_fffffffffffffee0._data,
                         (uchar *)in_stack_fffffffffffffed8);
      node_t::prefix((node_t *)&stack0xffffffffffffff88);
      node_t::set_prefix((node_t *)in_stack_fffffffffffffee0._data,
                         (uchar *)in_stack_fffffffffffffed8);
      node_t::first_bytes(in_stack_fffffffffffffed0);
      node_t::set_first_bytes
                ((node_t *)in_stack_fffffffffffffee0._data,(uchar *)in_stack_fffffffffffffed8);
      node_t::node_pointers((node_t *)in_stack_fffffffffffffee0._data);
      node_t::set_node_pointers
                ((node_t *)in_stack_fffffffffffffee0._data,(uchar *)in_stack_fffffffffffffed8);
      node_t::resize((node_t *)nVar2._data,(size_t)in_stack_fffffffffffffee8,
                     (size_t)in_stack_fffffffffffffee0._data);
      node_t::set_refcount((node_t *)&stack0xffffffffffffff88,0);
      node_t::prefix(local_a0);
      local_b0 = local_a0[0]._data;
      node_t::set_edge_at(in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0._data,
                          (uchar)((ulong)in_stack_fffffffffffffed8 >> 0x38),nVar2);
      node_t::prefix(&local_a8);
      local_b8 = local_a8._data;
      node_t::set_edge_at(in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0._data,
                          (uchar)((ulong)in_stack_fffffffffffffed8 >> 0x38),nVar2);
      in_RDI[1] = in_RDI[1] + 1;
      node_t::set_node_at(in_stack_fffffffffffffed8,(size_t)in_stack_fffffffffffffed0,
                          in_stack_fffffffffffffee0);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool zmq::radix_tree_t::add (const unsigned char *key_, size_t key_size_)
{
    const match_result_t match_result = match (key_, key_size_);
    const size_t key_bytes_matched = match_result._key_bytes_matched;
    const size_t prefix_bytes_matched = match_result._prefix_bytes_matched;
    const size_t edge_index = match_result._edge_index;
    node_t current_node = match_result._current_node;
    node_t parent_node = match_result._parent_node;

    if (key_bytes_matched != key_size_) {
        // Not all characters match, we might have to split the node.
        if (prefix_bytes_matched == current_node.prefix_length ()) {
            // The mismatch is at one of the outgoing edges, so we
            // create an edge from the current node to a new leaf node
            // that has the rest of the key as the prefix.
            node_t key_node = make_node (1, key_size_ - key_bytes_matched, 0);
            key_node.set_prefix (key_ + key_bytes_matched);

            // Reallocate for one more edge.
            current_node.resize (current_node.prefix_length (),
                                 current_node.edgecount () + 1);

            // Make room for the new edge. We need to shift the chunk
            // of node pointers one byte to the right. Since resize()
            // increments the edgecount by 1, node_pointers() tells us the
            // destination address. The chunk of node pointers starts
            // at one byte to the left of this destination.
            //
            // Since the regions can overlap, we use memmove.
            memmove (current_node.node_pointers (),
                     current_node.node_pointers () - 1,
                     (current_node.edgecount () - 1) * sizeof (void *));

            // Add an edge to the new node.
            current_node.set_edge_at (current_node.edgecount () - 1,
                                      key_[key_bytes_matched], key_node);

            // We need to update all pointers to the current node
            // after the call to resize().
            if (current_node.prefix_length () == 0)
                _root._data = current_node._data;
            else
                parent_node.set_node_at (edge_index, current_node);
            ++_size;
            return true;
        }

        // There was a mismatch, so we need to split this node.
        //
        // Create two nodes that will be reachable from the parent.
        // One node will have the rest of the characters from the key,
        // and the other node will have the rest of the characters
        // from the current node's prefix.
        node_t key_node = make_node (1, key_size_ - key_bytes_matched, 0);
        node_t split_node =
          make_node (current_node.refcount (),
                     current_node.prefix_length () - prefix_bytes_matched,
                     current_node.edgecount ());

        // Copy the prefix chunks to the new nodes.
        key_node.set_prefix (key_ + key_bytes_matched);
        split_node.set_prefix (current_node.prefix () + prefix_bytes_matched);

        // Copy the current node's edges to the new node.
        split_node.set_first_bytes (current_node.first_bytes ());
        split_node.set_node_pointers (current_node.node_pointers ());

        // Resize the current node to accommodate a prefix comprising
        // the matched characters and 2 outgoing edges to the above
        // nodes. Set the refcount to 0 since this node doesn't hold a
        // key.
        current_node.resize (prefix_bytes_matched, 2);
        current_node.set_refcount (0);

        // Add links to the new nodes. We don't need to copy the
        // prefix since resize() retains it in the current node.
        current_node.set_edge_at (0, key_node.prefix ()[0], key_node);
        current_node.set_edge_at (1, split_node.prefix ()[0], split_node);

        ++_size;
        parent_node.set_node_at (edge_index, current_node);
        return true;
    }

    // All characters in the key match, but we still might need to split.
    if (prefix_bytes_matched != current_node.prefix_length ()) {
        // All characters in the key match, but not all characters
        // from the current node's prefix match.

        // Create a node that contains the rest of the characters from
        // the current node's prefix and the outgoing edges from the
        // current node.
        node_t split_node =
          make_node (current_node.refcount (),
                     current_node.prefix_length () - prefix_bytes_matched,
                     current_node.edgecount ());
        split_node.set_prefix (current_node.prefix () + prefix_bytes_matched);
        split_node.set_first_bytes (current_node.first_bytes ());
        split_node.set_node_pointers (current_node.node_pointers ());

        // Resize the current node to hold only the matched characters
        // from its prefix and one edge to the new node.
        current_node.resize (prefix_bytes_matched, 1);

        // Add an edge to the split node and set the refcount to 1
        // since this key wasn't inserted earlier. We don't need to
        // set the prefix because the first `prefix_bytes_matched` bytes
        // in the prefix are preserved by resize().
        current_node.set_edge_at (0, split_node.prefix ()[0], split_node);
        current_node.set_refcount (1);

        ++_size;
        parent_node.set_node_at (edge_index, current_node);
        return true;
    }

    zmq_assert (key_bytes_matched == key_size_);
    zmq_assert (prefix_bytes_matched == current_node.prefix_length ());

    ++_size;
    current_node.set_refcount (current_node.refcount () + 1);
    return current_node.refcount () == 1;
}